

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

size_t __thiscall booster::aio::stream_socket::write_some(stream_socket *this,const_buffer *buffer)

{
  int iVar1;
  size_t sVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  error_code local_30;
  
  local_30._M_value = 0;
  local_30._M_cat = (error_category *)std::_V2::system_category();
  sVar2 = write_some(this,buffer,&local_30);
  iVar1 = local_30._M_value;
  if (local_30._M_value == 0) {
    return sVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = iVar1;
  eVar3._M_cat = local_30._M_cat;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

size_t stream_socket::write_some(const_buffer const &buffer)
{
	system::error_code e;
	size_t r=write_some(buffer,e);
	if(e)
		throw system::system_error(e);
	return r;
}